

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

void * ossl_get_internals(ssl_connect_data *connssl,CURLINFO info)

{
  return *(void **)((long)connssl->backend + (ulong)(info != CURLINFO_TLS_SESSION) * 8);
}

Assistant:

static void *ossl_get_internals(struct ssl_connect_data *connssl,
                                CURLINFO info)
{
  /* Legacy: CURLINFO_TLS_SESSION must return an SSL_CTX pointer. */
  struct ossl_ssl_backend_data *backend =
    (struct ossl_ssl_backend_data *)connssl->backend;
  DEBUGASSERT(backend);
  return info == CURLINFO_TLS_SESSION ?
    (void *)backend->ctx : (void *)backend->handle;
}